

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  int maxDecimalPlaces;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  double value;
  int length;
  int local_50;
  int local_4c;
  double local_48;
  
  if (((ulong)d & 0x7ff0000000000000) != 0x7ff0000000000000) {
    local_48 = d;
    pcVar3 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0x19);
    maxDecimalPlaces = this->maxDecimalPlaces_;
    if (maxDecimalPlaces < 1) {
      __assert_fail("maxDecimalPlaces >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/dtoa.h"
                    ,0xd9,"char *rapidjson::internal::dtoa(double, char *, int)");
    }
    if ((local_48 != 0.0) || (NAN(local_48))) {
      pcVar4 = pcVar3;
      value = local_48;
      if (local_48 < 0.0) {
        *pcVar3 = '-';
        pcVar4 = pcVar3 + 1;
        value = -local_48;
      }
      internal::Grisu2(value,pcVar4,&local_4c,&local_50);
      pcVar4 = internal::Prettify(pcVar4,local_4c,local_50,maxDecimalPlaces);
    }
    else {
      pcVar4 = pcVar3;
      if ((long)d < 0) {
        *pcVar3 = '-';
        pcVar4 = pcVar3 + 1;
      }
      pcVar4[0] = '0';
      pcVar4[1] = '.';
      pcVar4[2] = '0';
      pcVar4 = pcVar4 + 3;
    }
    pGVar1 = this->os_;
    pcVar2 = (pGVar1->stack_).stackTop_;
    if ((ulong)((long)pcVar2 - (long)(pGVar1->stack_).stack_) <
        ((long)pcVar3 - (long)pcVar4) + 0x19U) {
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/stack.h"
                    ,0x8b,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                   );
    }
    (pGVar1->stack_).stackTop_ = pcVar2 + (-0x19 - ((long)pcVar3 - (long)pcVar4));
  }
  return ((ulong)d & 0x7ff0000000000000) != 0x7ff0000000000000;
}

Assistant:

inline bool Writer<StringBuffer>::WriteDouble(double d) {
    if (internal::Double(d).IsNanOrInf()) {
        // Note: This code path can only be reached if (RAPIDJSON_WRITE_DEFAULT_FLAGS & kWriteNanAndInfFlag).
        if (!(kWriteDefaultFlags & kWriteNanAndInfFlag))
            return false;
        if (internal::Double(d).IsNan()) {
            PutReserve(*os_, 3);
            PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
            return true;
        }
        if (internal::Double(d).Sign()) {
            PutReserve(*os_, 9);
            PutUnsafe(*os_, '-');
        }
        else
            PutReserve(*os_, 8);
        PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
        PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
        return true;
    }
    
    char *buffer = os_->Push(25);
    char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
    os_->Pop(static_cast<size_t>(25 - (end - buffer)));
    return true;
}